

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_get_band_coordinates
               (opj_tcd_tilecomp_t *tilec,OPJ_UINT32 resno,OPJ_UINT32 bandno,OPJ_UINT32 tcx0,
               OPJ_UINT32 tcy0,OPJ_UINT32 tcx1,OPJ_UINT32 tcy1,OPJ_UINT32 *tbx0,OPJ_UINT32 *tby0,
               OPJ_UINT32 *tbx1,OPJ_UINT32 *tby1)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  OPJ_UINT32 local_54;
  OPJ_UINT32 local_50;
  OPJ_UINT32 local_4c;
  OPJ_UINT32 local_48;
  OPJ_UINT32 local_44;
  OPJ_UINT32 local_40;
  OPJ_UINT32 local_3c;
  OPJ_UINT32 local_38;
  OPJ_UINT32 local_34;
  OPJ_UINT32 y0b;
  OPJ_UINT32 x0b;
  OPJ_UINT32 nb;
  OPJ_UINT32 tcx1_local;
  OPJ_UINT32 tcy0_local;
  OPJ_UINT32 tcx0_local;
  OPJ_UINT32 bandno_local;
  OPJ_UINT32 resno_local;
  opj_tcd_tilecomp_t *tilec_local;
  
  if (resno == 0) {
    local_34 = tilec->numresolutions - 1;
  }
  else {
    local_34 = tilec->numresolutions - resno;
  }
  uVar2 = bandno & 1;
  uVar3 = bandno >> 1;
  cVar1 = (char)local_34;
  if (tbx0 != (OPJ_UINT32 *)0x0) {
    local_38 = tcx0;
    if (local_34 != 0) {
      if ((1 << (cVar1 - 1U & 0x1f)) * uVar2 < tcx0) {
        local_3c = opj_uint_ceildivpow2(tcx0 - (1 << (cVar1 - 1U & 0x1f)) * uVar2,local_34);
      }
      else {
        local_3c = 0;
      }
      local_38 = local_3c;
    }
    *tbx0 = local_38;
  }
  if (tby0 != (OPJ_UINT32 *)0x0) {
    local_40 = tcy0;
    if (local_34 != 0) {
      if ((1 << (cVar1 - 1U & 0x1f)) * uVar3 < tcy0) {
        local_44 = opj_uint_ceildivpow2(tcy0 - (1 << (cVar1 - 1U & 0x1f)) * uVar3,local_34);
      }
      else {
        local_44 = 0;
      }
      local_40 = local_44;
    }
    *tby0 = local_40;
  }
  if (tbx1 != (OPJ_UINT32 *)0x0) {
    local_48 = tcx1;
    if (local_34 != 0) {
      if ((1 << (cVar1 - 1U & 0x1f)) * uVar2 < tcx1) {
        local_4c = opj_uint_ceildivpow2(tcx1 - (1 << (cVar1 - 1U & 0x1f)) * uVar2,local_34);
      }
      else {
        local_4c = 0;
      }
      local_48 = local_4c;
    }
    *tbx1 = local_48;
  }
  if (tby1 != (OPJ_UINT32 *)0x0) {
    if (local_34 == 0) {
      local_50 = tcy1;
    }
    else {
      if ((1 << (cVar1 - 1U & 0x1f)) * uVar3 < tcy1) {
        local_54 = opj_uint_ceildivpow2(tcy1 - (1 << (cVar1 - 1U & 0x1f)) * uVar3,local_34);
      }
      else {
        local_54 = 0;
      }
      local_50 = local_54;
    }
    *tby1 = local_50;
  }
  return;
}

Assistant:

static void opj_dwt_get_band_coordinates(opj_tcd_tilecomp_t* tilec,
        OPJ_UINT32 resno,
        OPJ_UINT32 bandno,
        OPJ_UINT32 tcx0,
        OPJ_UINT32 tcy0,
        OPJ_UINT32 tcx1,
        OPJ_UINT32 tcy1,
        OPJ_UINT32* tbx0,
        OPJ_UINT32* tby0,
        OPJ_UINT32* tbx1,
        OPJ_UINT32* tby1)
{
    /* Compute number of decomposition for this band. See table F-1 */
    OPJ_UINT32 nb = (resno == 0) ?
                    tilec->numresolutions - 1 :
                    tilec->numresolutions - resno;
    /* Map above tile-based coordinates to sub-band-based coordinates per */
    /* equation B-15 of the standard */
    OPJ_UINT32 x0b = bandno & 1;
    OPJ_UINT32 y0b = bandno >> 1;
    if (tbx0) {
        *tbx0 = (nb == 0) ? tcx0 :
                (tcx0 <= (1U << (nb - 1)) * x0b) ? 0 :
                opj_uint_ceildivpow2(tcx0 - (1U << (nb - 1)) * x0b, nb);
    }
    if (tby0) {
        *tby0 = (nb == 0) ? tcy0 :
                (tcy0 <= (1U << (nb - 1)) * y0b) ? 0 :
                opj_uint_ceildivpow2(tcy0 - (1U << (nb - 1)) * y0b, nb);
    }
    if (tbx1) {
        *tbx1 = (nb == 0) ? tcx1 :
                (tcx1 <= (1U << (nb - 1)) * x0b) ? 0 :
                opj_uint_ceildivpow2(tcx1 - (1U << (nb - 1)) * x0b, nb);
    }
    if (tby1) {
        *tby1 = (nb == 0) ? tcy1 :
                (tcy1 <= (1U << (nb - 1)) * y0b) ? 0 :
                opj_uint_ceildivpow2(tcy1 - (1U << (nb - 1)) * y0b, nb);
    }
}